

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void ypr_status(lys_ypr_ctx_conflict *pctx,uint16_t flags,void *exts,int8_t *flag)

{
  char *local_30;
  char *status;
  int8_t *flag_local;
  void *exts_local;
  uint16_t flags_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  local_30 = (char *)0x0;
  if ((flags & 4) == 0) {
    if ((flags & 8) == 0) {
      if ((flags & 0x10) != 0) {
        ypr_close_parent(pctx,flag);
        local_30 = "obsolete";
      }
    }
    else {
      ypr_close_parent(pctx,flag);
      local_30 = "deprecated";
    }
  }
  else {
    ypr_close_parent(pctx,flag);
    local_30 = "current";
  }
  ypr_substmt(pctx,LY_STMT_STATUS,'\0',local_30,exts);
  return;
}

Assistant:

static void
ypr_status(struct lys_ypr_ctx *pctx, uint16_t flags, void *exts, int8_t *flag)
{
    const char *status = NULL;

    if (flags & LYS_STATUS_CURR) {
        ypr_close_parent(pctx, flag);
        status = "current";
    } else if (flags & LYS_STATUS_DEPRC) {
        ypr_close_parent(pctx, flag);
        status = "deprecated";
    } else if (flags & LYS_STATUS_OBSLT) {
        ypr_close_parent(pctx, flag);
        status = "obsolete";
    }

    ypr_substmt(pctx, LY_STMT_STATUS, 0, status, exts);
}